

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_name.c
# Opt level: O1

char * p2sc_name_swap_jhv(char *dateobs,char *telescop,char *instrume,char *detector,char *wavelnth)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  double d [6];
  
  iVar1 = p2sc_string2date(dateobs,d);
  if (iVar1 == 0) {
    pcVar2 = p2sc_strdup_replace(telescop,'/','-');
    pcVar3 = p2sc_strdup_replace(instrume,' ','_');
    pcVar4 = (char *)g_strdup_printf("%04d_%02d_%02d__%02d_%02d_%02d__%s_%s_%s_%s.",(int)d[0],
                                     (int)d[1],(int)d[2],(int)d[3],(int)d[4],(int)d[5],pcVar2,pcVar3
                                     ,detector,wavelnth);
    g_free(pcVar3);
    g_free(pcVar2);
    return pcVar4;
  }
  _p2sc_msg("p2sc_name_swap_jhv",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_name.c"
            ,0x56,"$Id: p2sc_name.c 5108 2014-06-19 12:29:23Z bogdan $",4000,"p2sc_string2date(%s)",
            dateobs);
  exit(1);
}

Assistant:

char *p2sc_name_swap_jhv(const char *dateobs, const char *telescop,
                         const char *instrume, const char *detector, const char *wavelnth) {
    double d[6];
    if (p2sc_string2date(dateobs, d))
        P2SC_Msg(LVL_FATAL, "p2sc_string2date(%s)", dateobs);

    /* avoid SDO/AIA */
    char *tele = p2sc_strdup_replace(telescop, '/', '-');
    /* avoid SUVI instrument name */
    char *inst = p2sc_strdup_replace(instrume, ' ', '_');
    /* final . to protect fractional wavelengths */
    char *ret = g_strdup_printf("%04d_%02d_%02d__%02d_%02d_%02d__%s_%s_%s_%s.",
                                (int) d[0], (int) d[1], (int) d[2], (int) d[3],
                                (int) d[4], (int) d[5],
                                tele, inst, detector, wavelnth);
    g_free(inst);
    g_free(tele);

    return ret;
}